

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O2

bool __thiscall google::protobuf::compiler::python::IsWellKnownType(python *this,string_view name)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  
  __x._M_str = (char *)name._M_len;
  __y._M_str = "google.protobuf.Any";
  __y._M_len = 0x13;
  __x._M_len = (size_t)this;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    __y_00._M_str = "google.protobuf.Duration";
    __y_00._M_len = 0x18;
    __x_00._M_str = __x._M_str;
    __x_00._M_len = (size_t)this;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      __y_01._M_str = "google.protobuf.FieldMask";
      __y_01._M_len = 0x19;
      __x_01._M_str = __x._M_str;
      __x_01._M_len = (size_t)this;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        __y_02._M_str = "google.protobuf.ListValue";
        __y_02._M_len = 0x19;
        __x_02._M_str = __x._M_str;
        __x_02._M_len = (size_t)this;
        bVar1 = std::operator==(__x_02,__y_02);
        if (!bVar1) {
          __y_03._M_str = "google.protobuf.Struct";
          __y_03._M_len = 0x16;
          __x_03._M_str = __x._M_str;
          __x_03._M_len = (size_t)this;
          bVar1 = std::operator==(__x_03,__y_03);
          if (!bVar1) {
            __y_04._M_str = "google.protobuf.Timestamp";
            __y_04._M_len = 0x19;
            __x_04._M_str = __x._M_str;
            __x_04._M_len = (size_t)this;
            bVar1 = std::operator==(__x_04,__y_04);
            return bVar1;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool IsWellKnownType(const absl::string_view name) {
  // LINT.IfChange(wktbases)
  return (name == "google.protobuf.Any" ||
          name == "google.protobuf.Duration" ||
          name == "google.protobuf.FieldMask" ||
          name == "google.protobuf.ListValue" ||
          name == "google.protobuf.Struct" ||
          name == "google.protobuf.Timestamp");
  // LINT.ThenChange(//depot/google3/net/proto2/python/internal/well_known_types.py:wktbases)
}